

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

_Bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemFlags extra_flags)

{
  short *psVar1;
  ImGuiItemStatusFlags *pIVar2;
  ImRect *pIVar3;
  ImGuiNavLayer IVar4;
  ImGuiWindow_conflict *window_00;
  ImGuiWindow_conflict *pIVar5;
  ImVec2 IVar6;
  ImGuiContext_conflict1 *pIVar7;
  _Bool _Var8;
  _Bool _Var9;
  uint uVar10;
  ImGuiID id_1;
  uint uVar11;
  ImGuiNavItemData *result;
  ImGuiContext_conflict1 *g;
  ImGuiWindow_conflict *window;
  float fVar12;
  float fVar13;
  float fVar14;
  ImRect nav_bb;
  
  pIVar7 = GImGui;
  window_00 = GImGui->CurrentWindow;
  (GImGui->LastItemData).ID = id;
  IVar6 = bb->Max;
  (pIVar7->LastItemData).Rect.Min = bb->Min;
  (pIVar7->LastItemData).Rect.Max = IVar6;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  IVar6 = nav_bb_arg->Max;
  (pIVar7->LastItemData).NavRect.Min = nav_bb_arg->Min;
  (pIVar7->LastItemData).NavRect.Max = IVar6;
  uVar11 = pIVar7->CurrentItemFlags | extra_flags;
  (pIVar7->LastItemData).InFlags = uVar11;
  (pIVar7->LastItemData).StatusFlags = 0;
  if (id == 0) goto LAB_001bc182;
  IVar4 = (window_00->DC).NavLayerCurrent;
  psVar1 = &(window_00->DC).NavLayersActiveMaskNext;
  *psVar1 = *psVar1 | (ushort)(1 << ((byte)IVar4 & 0x1f));
  if ((((pIVar7->NavId != id) && (pIVar7->NavAnyRequest != true)) ||
      (pIVar5 = pIVar7->NavWindow, pIVar5->RootWindowForNav != window_00->RootWindowForNav)) ||
     ((window_00 != pIVar5 && (((uint)(pIVar5->Flags | window_00->Flags) >> 0x17 & 1) == 0))))
  goto LAB_001bc182;
  nav_bb.Min = (pIVar7->LastItemData).NavRect.Min;
  nav_bb.Max = (pIVar7->LastItemData).NavRect.Max;
  if (((pIVar7->NavInitRequest == true) && (pIVar7->NavLayer == IVar4)) &&
     (((uVar11 & 0x14) == 0 || (pIVar7->NavInitResultId == 0)))) {
    pIVar7->NavInitResultId = id;
    fVar12 = (window_00->Pos).x;
    fVar13 = (window_00->Pos).y;
    (pIVar7->NavInitResultRectRel).Min.x = nav_bb.Min.x - fVar12;
    (pIVar7->NavInitResultRectRel).Min.y = nav_bb.Min.y - fVar13;
    (pIVar7->NavInitResultRectRel).Max.x = nav_bb.Max.x - fVar12;
    (pIVar7->NavInitResultRectRel).Max.y = nav_bb.Max.y - fVar13;
    if ((uVar11 & 0x14) == 0) {
      pIVar7->NavInitRequest = false;
      NavUpdateAnyRequestFlag();
    }
  }
  if (pIVar7->NavMoveScoringItems == true) {
    if ((uVar11 >> 8 & 1) != 0) {
      pIVar7->NavTabbingInputableRemaining = pIVar7->NavTabbingInputableRemaining + -1;
    }
    if (pIVar7->NavId == id) {
      uVar10 = pIVar7->NavMoveFlags;
      if (((byte)uVar10 >> 4 & (uVar11 & 0xc) == 0) != 0) {
LAB_001bc2ae:
        result = &pIVar7->NavMoveResultOther;
        if (window_00 == pIVar7->NavWindow) {
          result = &pIVar7->NavMoveResultLocal;
        }
        if ((uVar10 >> 9 & 1) == 0) {
          _Var8 = NavScoreItem(result);
          if (_Var8) {
            NavApplyItemToResult(result);
          }
          if (((pIVar7->NavMoveFlags & 0x20) != 0) &&
             (_Var8 = ImRect::Overlaps(&window_00->ClipRect,&nav_bb), _Var8)) {
            fVar12 = (window_00->ClipRect).Min.y;
            fVar13 = (window_00->ClipRect).Max.y;
            fVar14 = fVar13;
            if (nav_bb.Max.y <= fVar13) {
              fVar14 = nav_bb.Max.y;
            }
            if (nav_bb.Min.y <= fVar13) {
              fVar13 = nav_bb.Min.y;
            }
            if ((nav_bb.Max.y - nav_bb.Min.y) * 0.7 <=
                (float)(-(uint)(nav_bb.Max.y < fVar12) & (uint)fVar12 |
                       ~-(uint)(nav_bb.Max.y < fVar12) & (uint)fVar14) -
                (float)(-(uint)(nav_bb.Min.y < fVar12) & (uint)fVar12 |
                       ~-(uint)(nav_bb.Min.y < fVar12) & (uint)fVar13)) {
              _Var8 = NavScoreItem(&pIVar7->NavMoveResultLocalVisible);
              if (_Var8) {
                NavApplyItemToResult(&pIVar7->NavMoveResultLocalVisible);
              }
            }
          }
        }
        else if (pIVar7->NavTabbingInputableRemaining == 0) {
          NavMoveRequestResolveWithLastItem();
        }
      }
    }
    else if ((uVar11 & 0xc) == 0) {
      uVar10 = pIVar7->NavMoveFlags;
      goto LAB_001bc2ae;
    }
  }
  if (pIVar7->NavId == id) {
    pIVar7->NavWindow = window_00;
    IVar4 = (window_00->DC).NavLayerCurrent;
    pIVar7->NavLayer = IVar4;
    pIVar7->NavFocusScopeId = (window_00->DC).NavFocusScopeIdCurrent;
    pIVar7->NavIdIsAlive = true;
    fVar12 = (window_00->Pos).x;
    fVar13 = (window_00->Pos).y;
    pIVar3 = window_00->NavRectRel + IVar4;
    (pIVar3->Min).x = nav_bb.Min.x - fVar12;
    (pIVar3->Min).y = nav_bb.Min.y - fVar13;
    (pIVar3->Max).x = nav_bb.Max.x - fVar12;
    (pIVar3->Max).y = nav_bb.Max.y - fVar13;
  }
LAB_001bc182:
  (pIVar7->NextItemData).Flags = 0;
  _Var8 = IsClippedEx(bb,id);
  if (!_Var8) {
    if (((uint)extra_flags >> 8 & 1) != 0) {
      ItemInputable(window_00,id);
    }
    _Var9 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if (_Var9) {
      pIVar2 = &(pIVar7->LastItemData).StatusFlags;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
    }
  }
  return !_Var8;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Set item data
    // (DisplayRect is left untouched, made valid when ImGuiItemStatusFlags_HasDisplayRect is set)
    g.LastItemData.ID = id;
    g.LastItemData.Rect = bb;
    g.LastItemData.NavRect = nav_bb_arg ? *nav_bb_arg : bb;
    g.LastItemData.InFlags = g.CurrentItemFlags | extra_flags;
    g.LastItemData.StatusFlags = ImGuiItemStatusFlags_None;

    // Directional navigation processing
    if (id != 0)
    {
        // Runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem();

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // [WIP] Tab stop handling (previously was using internal FocusableItemRegister() api)
    // FIXME-NAV: We would now want to move this before the clipping test, but this would require being able to scroll and currently this would mean an extra frame. (#4079, #343)
    if (extra_flags & ImGuiItemFlags_Inputable)
        ItemInputable(window, id);

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}